

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O2

int uws_client_close_handshake_async
              (UWS_CLIENT_HANDLE uws_client,uint16_t close_code,char *close_reason,
              ON_WS_CLOSE_COMPLETE on_ws_close_complete,void *on_ws_close_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE item_handle;
  WS_PENDING_SEND *ws_pending_send;
  int iVar3;
  char *pcVar4;
  
  if (uws_client == (UWS_CLIENT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x747;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x747;
    }
    pcVar4 = "NULL uws_client";
    iVar3 = 0x746;
  }
  else if ((uws_client->uws_state < UWS_STATE_ERROR) &&
          ((0x71U >> (uws_client->uws_state & 0x1f) & 1) != 0)) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x753;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x753;
    }
    pcVar4 = "uws_client_close_handshake_async has been called when already CLOSED";
    iVar3 = 0x752;
  }
  else {
    uws_client->on_ws_close_complete = on_ws_close_complete;
    uws_client->on_ws_close_complete_context = on_ws_close_complete_context;
    uws_client->uws_state = UWS_STATE_CLOSING_WAITING_FOR_CLOSE;
    iVar1 = send_close_frame(uws_client,(uint)close_code);
    if (iVar1 == 0) {
      while (item_handle = singlylinkedlist_get_head_item(uws_client->pending_sends),
            item_handle != (LIST_ITEM_HANDLE)0x0) {
        ws_pending_send = (WS_PENDING_SEND *)singlylinkedlist_item_get_value(item_handle);
        if (ws_pending_send != (WS_PENDING_SEND *)0x0) {
          complete_send_frame(ws_pending_send,item_handle,WS_SEND_FRAME_CANCELLED);
        }
      }
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x766;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x766;
    }
    pcVar4 = "Sending CLOSE frame failed";
    iVar3 = 0x765;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
            ,"uws_client_close_handshake_async",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int uws_client_close_handshake_async(UWS_CLIENT_HANDLE uws_client, uint16_t close_code, const char* close_reason, ON_WS_CLOSE_COMPLETE on_ws_close_complete, void* on_ws_close_complete_context)
{
    int result;

    if (uws_client == NULL)
    {
        /* Codes_SRS_UWS_CLIENT_01_467: [ if uws_client is NULL, uws_client_close_handshake_async shall return a non-zero value. ]*/
        LogError("NULL uws_client");
        result = MU_FAILURE;
    }
    else
    {
        if ((uws_client->uws_state == UWS_STATE_CLOSED) ||
            /* Codes_SRS_UWS_CLIENT_01_474: [ uws_client_close_handshake_async when already CLOSING shall fail and return a non-zero value. ]*/
            (uws_client->uws_state == UWS_STATE_CLOSING_WAITING_FOR_CLOSE) ||
            (uws_client->uws_state == UWS_STATE_CLOSING_SENDING_CLOSE) ||
            (uws_client->uws_state == UWS_STATE_CLOSING_UNDERLYING_IO))
        {
            /* Codes_SRS_UWS_CLIENT_01_473: [ uws_client_close_handshake_async when no open action has been issued shall fail and return a non-zero value. ]*/
            LogError("uws_client_close_handshake_async has been called when already CLOSED");
            result = MU_FAILURE;
        }
        else
        {
            (void)close_reason;

            /* Codes_SRS_UWS_CLIENT_01_468: [ on_ws_close_complete and on_ws_close_complete_context shall be saved and the callback on_ws_close_complete shall be triggered when the close is complete. ]*/
            /* Codes_SRS_UWS_CLIENT_01_469: [ The on_ws_close_complete argument shall be allowed to be NULL, in which case no callback shall be called when the close is complete. ]*/
            /* Codes_SRS_UWS_CLIENT_01_470: [ on_ws_close_complete_context shall also be allowed to be NULL. ]*/
            uws_client->on_ws_close_complete = on_ws_close_complete;
            uws_client->on_ws_close_complete_context = on_ws_close_complete_context;

            uws_client->uws_state = UWS_STATE_CLOSING_WAITING_FOR_CLOSE;

            /* Codes_SRS_UWS_CLIENT_01_465: [ uws_client_close_handshake_async shall initiate the close handshake by sending a close frame to the peer. ]*/
            if (send_close_frame(uws_client, close_code) != 0)
            {
                /* Codes_SRS_UWS_CLIENT_01_472: [ If xio_send fails, uws_client_close_handshake_async shall fail and return a non-zero value. ]*/
                LogError("Sending CLOSE frame failed");
                result = MU_FAILURE;
            }
            else
            {
                LIST_ITEM_HANDLE first_pending_send;

                while ((first_pending_send = singlylinkedlist_get_head_item(uws_client->pending_sends)) != NULL)
                {
                    WS_PENDING_SEND* ws_pending_send = (WS_PENDING_SEND*)singlylinkedlist_item_get_value(first_pending_send);
                    if (ws_pending_send != NULL)
                    {
                        complete_send_frame(ws_pending_send, first_pending_send, WS_SEND_FRAME_CANCELLED);
                    }
                }

                /* Codes_SRS_UWS_CLIENT_01_466: [ On success uws_client_close_handshake_async shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}